

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::PushItemFlag(ImGuiItemFlags option,bool enabled)

{
  uint uVar1;
  uint uVar2;
  ImGuiContext *pIVar3;
  undefined7 in_register_00000031;
  int local_4;
  
  pIVar3 = GImGui;
  uVar1 = (GImGui->CurrentWindow->DC).ItemFlags;
  uVar2 = uVar1 | option;
  if ((int)CONCAT71(in_register_00000031,enabled) == 0) {
    uVar2 = ~option & uVar1;
  }
  (GImGui->CurrentWindow->DC).ItemFlags = uVar2;
  ImVector<int>::push_back(&pIVar3->ItemFlagsStack,&local_4);
  return;
}

Assistant:

void ImGui::PushItemFlag(ImGuiItemFlags option, bool enabled)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    ImGuiItemFlags item_flags = window->DC.ItemFlags;
    IM_ASSERT(item_flags == g.ItemFlagsStack.back());
    if (enabled)
        item_flags |= option;
    else
        item_flags &= ~option;
    window->DC.ItemFlags = item_flags;
    g.ItemFlagsStack.push_back(item_flags);
}